

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VisionFeaturePrint.pb.cc
# Opt level: O0

bool CoreML::Specification::CoreMLModels::VisionFeaturePrint_Objects_ObjectsVersion_Parse
               (ConstStringParam name,VisionFeaturePrint_Objects_ObjectsVersion *value)

{
  bool bVar1;
  int *in_R9;
  StringPiece name_00;
  StringPiece local_30;
  VisionFeaturePrint_Objects_ObjectsVersion local_1c;
  bool success;
  VisionFeaturePrint_Objects_ObjectsVersion *pVStack_18;
  int int_value;
  VisionFeaturePrint_Objects_ObjectsVersion *value_local;
  ConstStringParam name_local;
  
  pVStack_18 = value;
  value_local = (VisionFeaturePrint_Objects_ObjectsVersion *)name;
  google::protobuf::stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
            (&local_30,name);
  name_00.length_ = (size_type)&local_1c;
  name_00.ptr_ = (char *)local_30.length_;
  bVar1 = google::protobuf::internal::LookUpEnumValue
                    ((internal *)VisionFeaturePrint_Objects_ObjectsVersion_entries,(EnumEntry *)0x2,
                     (size_t)local_30.ptr_,name_00,in_R9);
  if (bVar1) {
    *pVStack_18 = local_1c;
  }
  return bVar1;
}

Assistant:

bool VisionFeaturePrint_Objects_ObjectsVersion_Parse(
    ::PROTOBUF_NAMESPACE_ID::ConstStringParam name, VisionFeaturePrint_Objects_ObjectsVersion* value) {
  int int_value;
  bool success = ::PROTOBUF_NAMESPACE_ID::internal::LookUpEnumValue(
      VisionFeaturePrint_Objects_ObjectsVersion_entries, 2, name, &int_value);
  if (success) {
    *value = static_cast<VisionFeaturePrint_Objects_ObjectsVersion>(int_value);
  }
  return success;
}